

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# item_event_visitor.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::visit_double
          (basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_> *this,double value,
          semantic_tag tag,ser_context *context,error_code *ec)

{
  char cVar1;
  bool bVar2;
  target_t tVar3;
  reference pvVar4;
  size_t sVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__i;
  const_iterator __p;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __beg;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __end;
  long in_RDI;
  write_double f;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sink
  ;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000170;
  double in_stack_00000178;
  write_double *in_stack_00000180;
  error_code *in_stack_fffffffffffffef8;
  level *in_stack_ffffffffffffff00;
  string_view_type *in_stack_ffffffffffffff08;
  write_double *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff38;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffff40;
  const_iterator in_stack_ffffffffffffff48;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_30 [6];
  
  pvVar4 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                   *)in_stack_ffffffffffffff00);
  bVar2 = level::is_key(pvVar4);
  if (!bVar2) {
    pvVar4 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff00);
    tVar3 = level::target(pvVar4);
    if (tVar3 != buffer) goto LAB_001a7782;
  }
  in_stack_ffffffffffffff10 = (write_double *)(in_RDI + 0x18);
  std::__cxx11::string::clear();
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  string_sink(local_30,(container_type *)in_stack_ffffffffffffff10);
  detail::write_double::write_double
            (in_stack_ffffffffffffff10,
             (float_chars_format)((ulong)in_stack_ffffffffffffff08 >> 0x38),
             (int)in_stack_ffffffffffffff08);
  detail::write_double::operator()(in_stack_00000180,in_stack_00000178,in_stack_00000170);
  detail::write_double::~write_double((write_double *)0x1a775a);
LAB_001a7782:
  pvVar4 = std::
           vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
           ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                   *)in_stack_ffffffffffffff00);
  bVar2 = level::is_key(pvVar4);
  cVar1 = (char)in_RDI;
  if (bVar2) {
    pvVar4 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff00);
    tVar3 = level::target(pvVar4);
    if (tVar3 == buffer) {
      pvVar4 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       *)in_stack_ffffffffffffff00);
      sVar5 = level::count(pvVar4);
      if (sVar5 != 0) {
        std::__cxx11::string::push_back(cVar1 + '8');
      }
      std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff00,
                 (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_fffffffffffffef8);
      std::__cxx11::string::begin();
      std::__cxx11::string::end();
      std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (in_stack_ffffffffffffff30,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
                 in_stack_ffffffffffffff38);
      std::__cxx11::string::push_back(cVar1 + '8');
    }
    else {
      in_stack_ffffffffffffff00 = *(level **)(in_RDI + 0x10);
      std::__cxx11::string::operator_cast_to_basic_string_view((string *)(in_RDI + 0x18));
      basic_json_visitor<char>::key
                ((basic_json_visitor<char> *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                 (ser_context *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    }
  }
  else {
    pvVar4 = std::
             vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
             ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                     *)in_stack_ffffffffffffff00);
    tVar3 = level::target(pvVar4);
    if (tVar3 == buffer) {
      pvVar4 = std::
               vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
               ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                       *)in_stack_ffffffffffffff00);
      bVar2 = level::is_object(pvVar4);
      if (!bVar2) {
        pvVar4 = std::
                 vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                 ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
                         *)in_stack_ffffffffffffff00);
        sVar5 = level::count(pvVar4);
        if (sVar5 != 0) {
          std::__cxx11::string::push_back(cVar1 + '8');
        }
      }
      __i = (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(in_RDI + 0x38);
      __p._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)in_stack_ffffffffffffff00,__i);
      __beg._M_current = (char *)std::__cxx11::string::begin();
      __end._M_current = (char *)std::__cxx11::string::end();
      std::__cxx11::string::insert<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
                (in_stack_ffffffffffffff30,__p,__beg,__end);
    }
    else {
      basic_json_visitor<char>::double_value
                ((basic_json_visitor<char> *)in_stack_ffffffffffffff10,
                 (double)in_stack_ffffffffffffff08,
                 (semantic_tag)((ulong)in_stack_ffffffffffffff00 >> 0x38),
                 (ser_context *)in_stack_fffffffffffffef8,(error_code *)0x1a79dc);
    }
  }
  std::
  vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
  ::back((vector<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level,_std::allocator<jsoncons::basic_item_event_visitor_to_json_visitor<char,_std::allocator<char>_>::level>_>
          *)in_stack_ffffffffffffff00);
  level::advance(in_stack_ffffffffffffff00);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_double(double value, semantic_tag tag, const ser_context& context, std::error_code& ec) override
        {
            if (level_stack_.back().is_key() || level_stack_.back().target() == target_t::buffer)
            {
                key_.clear();
                string_sink<string_type> sink(key_);
                jsoncons::detail::write_double f{float_chars_format::general,0};
                f(value, sink);
            }

            if (level_stack_.back().is_key())
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        key_buffer_.push_back(':');
                        break;
                    default:
                        destination_->key(key_, context, ec);
                        break;
                }
            }
            else
            {
                switch (level_stack_.back().target())
                {
                    case target_t::buffer:
                        if (!level_stack_.back().is_object() && level_stack_.back().count() > 0)
                        {
                            key_buffer_.push_back(',');
                        }
                        key_buffer_.insert(key_buffer_.end(), key_.begin(), key_.end());
                        break;
                    default:
                        destination_->double_value(value, tag, context, ec);
                        break;
                }
            }

            level_stack_.back().advance();
            JSONCONS_VISITOR_RETURN;
        }